

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

int crec_isnonzero(CType *s,void *p)

{
  void *p_local;
  CType *s_local;
  
  if (p == (void *)0x0) {
    s_local._4_4_ = 0;
  }
  else if (p == (void *)0x1) {
    s_local._4_4_ = 1;
  }
  else if ((s->info & 0x4000000) == 0) {
    if (s->size == 1) {
      s_local._4_4_ = (uint)(*p != '\0');
    }
    else if (s->size == 2) {
      s_local._4_4_ = (uint)(*p != 0);
    }
    else if (s->size == 4) {
      s_local._4_4_ = (uint)(*p != 0);
    }
    else {
      s_local._4_4_ = (uint)(*p != 0);
    }
  }
  else if (s->size == 4) {
    s_local._4_4_ = (uint)(*p != 0.0);
  }
  else {
    s_local._4_4_ = (uint)(*p != 0.0);
  }
  return s_local._4_4_;
}

Assistant:

static int crec_isnonzero(CType *s, void *p)
{
  if (p == (void *)0)
    return 0;
  if (p == (void *)1)
    return 1;
  if ((s->info & CTF_FP)) {
    if (s->size == sizeof(float))
      return (*(float *)p != 0);
    else
      return (*(double *)p != 0);
  } else {
    if (s->size == 1)
      return (*(uint8_t *)p != 0);
    else if (s->size == 2)
      return (*(uint16_t *)p != 0);
    else if (s->size == 4)
      return (*(uint32_t *)p != 0);
    else
      return (*(uint64_t *)p != 0);
  }
}